

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SplitNDLayerParams::MergeFrom
          (SplitNDLayerParams *this,SplitNDLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1001a);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar1 = (from->splitsizes_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->splitsizes_,iVar1 + (this->splitsizes_).current_size_);
    memcpy(((this->splitsizes_).rep_)->elements + (this->splitsizes_).current_size_,
           ((from->splitsizes_).rep_)->elements,(long)(from->splitsizes_).current_size_ << 3);
    (this->splitsizes_).current_size_ =
         (this->splitsizes_).current_size_ + (from->splitsizes_).current_size_;
  }
  if (from->axis_ != 0) {
    this->axis_ = from->axis_;
  }
  if (from->numsplits_ != 0) {
    this->numsplits_ = from->numsplits_;
  }
  return;
}

Assistant:

void SplitNDLayerParams::MergeFrom(const SplitNDLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SplitNDLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  splitsizes_.MergeFrom(from.splitsizes_);
  if (from.axis() != 0) {
    set_axis(from.axis());
  }
  if (from.numsplits() != 0) {
    set_numsplits(from.numsplits());
  }
}